

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

xmlChar * xmlLoadFileContent(char *filename)

{
  int iVar1;
  ssize_t sVar2;
  xmlChar *content;
  stat info;
  long size;
  int len;
  int fd;
  char *filename_local;
  
  if (filename == (char *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    iVar1 = stat64(filename,(stat64 *)&content);
    if (iVar1 < 0) {
      filename_local = (char *)0x0;
    }
    else {
      iVar1 = open64(filename,0);
      if (iVar1 < 0) {
        filename_local = (char *)0x0;
      }
      else {
        info.__glibc_reserved[2] = info.st_rdev;
        filename_local = (char *)(*xmlMallocAtomic)(info.st_rdev + 10);
        if (filename_local == (char *)0x0) {
          xmlCatalogErrMemory("allocating catalog data");
          close(iVar1);
          filename_local = (char *)0x0;
        }
        else {
          sVar2 = read(iVar1,filename_local,info.__glibc_reserved[2]);
          close(iVar1);
          if ((int)sVar2 < 0) {
            (*xmlFree)(filename_local);
            filename_local = (char *)0x0;
          }
          else {
            filename_local[(int)sVar2] = '\0';
          }
        }
      }
    }
  }
  return (xmlChar *)filename_local;
}

Assistant:

static xmlChar *
xmlLoadFileContent(const char *filename)
{
#ifdef HAVE_STAT
    int fd;
#else
    FILE *fd;
#endif
    int len;
    long size;

#ifdef HAVE_STAT
    struct stat info;
#endif
    xmlChar *content;

    if (filename == NULL)
        return (NULL);

#ifdef HAVE_STAT
    if (stat(filename, &info) < 0)
        return (NULL);
#endif

#ifdef HAVE_STAT
    if ((fd = open(filename, O_RDONLY)) < 0)
#else
    if ((fd = fopen(filename, "rb")) == NULL)
#endif
    {
        return (NULL);
    }
#ifdef HAVE_STAT
    size = info.st_size;
#else
    if (fseek(fd, 0, SEEK_END) || (size = ftell(fd)) == EOF || fseek(fd, 0, SEEK_SET)) {        /* File operations denied? ok, just close and return failure */
        fclose(fd);
        return (NULL);
    }
#endif
    content = (xmlChar*)xmlMallocAtomic(size + 10);
    if (content == NULL) {
        xmlCatalogErrMemory("allocating catalog data");
#ifdef HAVE_STAT
	close(fd);
#else
	fclose(fd);
#endif
        return (NULL);
    }
#ifdef HAVE_STAT
    len = read(fd, content, size);
    close(fd);
#else
    len = fread(content, 1, size, fd);
    fclose(fd);
#endif
    if (len < 0) {
        xmlFree(content);
        return (NULL);
    }
    content[len] = 0;

    return(content);
}